

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

void __thiscall cmCTest::SetCTestConfiguration(cmCTest *this,char *name,char *value,bool suppress)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  char *pcVar3;
  char *local_1c0 [4];
  ostringstream cmCTestLog_msg;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar1 = std::operator<<((ostream *)&cmCTestLog_msg,"SetCTestConfiguration:");
  poVar1 = std::operator<<(poVar1,name);
  poVar1 = std::operator<<(poVar1,":");
  pcVar3 = "(null)";
  if (value != (char *)0x0) {
    pcVar3 = value;
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  Log(this,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0xa39,local_1c0[0],suppress);
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  if (name != (char *)0x0) {
    if (value == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCTestLog_msg,name,(allocator<char> *)local_1c0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::erase(&(this->CTestConfiguration)._M_t,(key_type *)&cmCTestLog_msg);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCTestLog_msg,name,(allocator<char> *)local_1c0);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->CTestConfiguration,(key_type *)&cmCTestLog_msg);
      std::__cxx11::string::assign((char *)pmVar2);
    }
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  return;
}

Assistant:

void cmCTest::SetCTestConfiguration(const char* name, const char* value,
                                    bool suppress)
{
  cmCTestOptionalLog(this, HANDLER_VERBOSE_OUTPUT,
                     "SetCTestConfiguration:"
                       << name << ":" << (value ? value : "(null)") << "\n",
                     suppress);

  if (!name) {
    return;
  }
  if (!value) {
    this->CTestConfiguration.erase(name);
    return;
  }
  this->CTestConfiguration[name] = value;
}